

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O1

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::FunctionInliningCase::generateProgramData
          (ProgramData *__return_storage_ptr__,FunctionInliningCase *this,bool optimized)

{
  ProgramData *pPVar1;
  undefined8 *puVar2;
  long *plVar3;
  undefined8 uVar4;
  size_type *psVar5;
  long *plVar6;
  ulong *puVar7;
  undefined7 in_register_00000011;
  char cVar8;
  ulong uVar9;
  int iVar10;
  FunctionInliningCase *pFVar11;
  string mainValueStatement;
  string expression;
  string precision;
  string maybeFuncDefs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string local_328;
  ulong *local_308;
  long local_300;
  ulong local_2f8;
  long lStack_2f0;
  int local_2e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  undefined4 *local_2a0;
  long local_298;
  undefined4 local_290;
  undefined1 uStack_28c;
  undefined1 uStack_28b;
  undefined2 uStack_28a;
  long *local_280;
  undefined8 local_278;
  long local_270;
  undefined8 uStack_268;
  undefined4 local_25c;
  string local_258;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  FunctionInliningCase *local_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  ProgramData *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  local_2a0 = &local_290;
  if (CASESHADERTYPE_FRAGMENT < (this->super_ShaderOptimizationCase).m_caseShaderType) {
    uVar4 = std::__throw_logic_error("basic_string::_M_construct null not valid");
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,local_2b0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if (local_2a0 != &local_290) {
      operator_delete(local_2a0,
                      CONCAT26(uStack_28a,CONCAT15(uStack_28b,CONCAT14(uStack_28c,local_290))) + 1);
    }
    _Unwind_Resume(uVar4);
  }
  uStack_28c = 0x70;
  local_290 = 0x68676968;
  local_298 = 5;
  uStack_28b = 0;
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,"value*vec4(0.8, 0.7, 0.6, 0.9)","");
  local_25c = (undefined4)CONCAT71(in_register_00000011,optimized);
  local_1f8 = this;
  local_1b0 = __return_storage_ptr__;
  if (optimized) {
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,0x1b32ab9);
  }
  else {
    local_2e4 = this->m_callNestingDepth;
    local_308 = &local_2f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,local_2a0,local_298 + (long)local_2a0);
    std::__cxx11::string::append((char *)&local_308);
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_2a0);
    psVar5 = puVar2 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_348.field_2._M_allocated_capacity = *psVar5;
      local_348.field_2._8_8_ = puVar2[3];
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    }
    else {
      local_348.field_2._M_allocated_capacity = *psVar5;
      local_348._M_dataplus._M_p = (pointer)*puVar2;
    }
    local_348._M_string_length = puVar2[1];
    *puVar2 = psVar5;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_348);
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_328.field_2._M_allocated_capacity = *psVar5;
      local_328.field_2._8_8_ = plVar3[3];
    }
    else {
      local_328.field_2._M_allocated_capacity = *psVar5;
      local_328._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_328._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_328,(ulong)local_2e0._M_dataplus._M_p);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_198 = *plVar6;
      lStack_190 = plVar3[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar6;
      local_1a8 = (long *)*plVar3;
    }
    local_1a0 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_258.field_2._M_allocated_capacity = *psVar5;
      local_258.field_2._8_8_ = plVar3[3];
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar5;
      local_258._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_258._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (1 < local_2e4) {
      iVar10 = 1;
      do {
        local_1f0 = local_1e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,local_2a0,local_298 + (long)local_2a0);
        std::__cxx11::string::append((char *)&local_1f0);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar10);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar9 = 0xf;
        if (local_1f0 != local_1e0) {
          uVar9 = local_1e0[0];
        }
        if (uVar9 < (ulong)(local_210 + local_1e8)) {
          uVar9 = 0xf;
          if (local_218 != local_208) {
            uVar9 = local_208[0];
          }
          if (uVar9 < (ulong)(local_210 + local_1e8)) goto LAB_012f10aa;
          puVar2 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_1f0);
        }
        else {
LAB_012f10aa:
          puVar2 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_218);
        }
        local_280 = &local_270;
        plVar3 = puVar2 + 2;
        if ((long *)*puVar2 == plVar3) {
          local_270 = *plVar3;
          uStack_268 = puVar2[3];
        }
        else {
          local_270 = *plVar3;
          local_280 = (long *)*puVar2;
        }
        local_278 = puVar2[1];
        *puVar2 = plVar3;
        puVar2[1] = 0;
        *(undefined1 *)plVar3 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_280);
        local_1d0 = &local_1c0;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_1c0 = *plVar6;
          lStack_1b8 = plVar3[3];
        }
        else {
          local_1c0 = *plVar6;
          local_1d0 = (long *)*plVar3;
        }
        local_1c8 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_2a0);
        local_2c0 = &local_2b0;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_2b0 = *plVar6;
          lStack_2a8 = plVar3[3];
        }
        else {
          local_2b0 = *plVar6;
          local_2c0 = (long *)*plVar3;
        }
        local_2b8 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_2c0);
        puVar7 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar7) {
          local_2f8 = *puVar7;
          lStack_2f0 = plVar3[3];
          local_308 = &local_2f8;
        }
        else {
          local_2f8 = *puVar7;
          local_308 = (ulong *)*plVar3;
        }
        local_300 = plVar3[1];
        *plVar3 = (long)puVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar10 + -1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar9 = 0xf;
        if (local_308 != &local_2f8) {
          uVar9 = local_2f8;
        }
        if (uVar9 < (ulong)(local_230 + local_300)) {
          uVar9 = 0xf;
          if (local_238 != local_228) {
            uVar9 = local_228[0];
          }
          if (uVar9 < (ulong)(local_230 + local_300)) goto LAB_012f12e6;
          puVar2 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_308);
        }
        else {
LAB_012f12e6:
          puVar2 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_238);
        }
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        psVar5 = puVar2 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_348.field_2._M_allocated_capacity = *psVar5;
          local_348.field_2._8_8_ = puVar2[3];
        }
        else {
          local_348.field_2._M_allocated_capacity = *psVar5;
          local_348._M_dataplus._M_p = (pointer)*puVar2;
        }
        local_348._M_string_length = puVar2[1];
        *puVar2 = psVar5;
        puVar2[1] = 0;
        *(undefined1 *)psVar5 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_348);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_328.field_2._M_allocated_capacity = *psVar5;
          local_328.field_2._8_8_ = plVar3[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *psVar5;
          local_328._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_328._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_328._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        if (local_238 != local_228) {
          operator_delete(local_238,local_228[0] + 1);
        }
        if (local_308 != &local_2f8) {
          operator_delete(local_308,local_2f8 + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0,local_1c0 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if (local_218 != local_208) {
          operator_delete(local_218,local_208[0] + 1);
        }
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0,local_1e0[0] + 1);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 != local_2e4);
    }
  }
  pFVar11 = local_1f8;
  cVar8 = (char)local_25c;
  if (cVar8 == '\0') {
    iVar10 = local_1f8->m_callNestingDepth;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<(&local_1a8,iVar10 + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,0x1c2181d);
    local_308 = &local_2f8;
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_2f8 = *puVar7;
      lStack_2f0 = plVar3[3];
    }
    else {
      local_2f8 = *puVar7;
      local_308 = (ulong *)*plVar3;
    }
    local_300 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_308);
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    psVar5 = puVar2 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_348.field_2._M_allocated_capacity = *psVar5;
      local_348.field_2._8_8_ = puVar2[3];
    }
    else {
      local_348.field_2._M_allocated_capacity = *psVar5;
      local_348._M_dataplus._M_p = (pointer)*puVar2;
    }
    local_348._M_string_length = puVar2[1];
    *puVar2 = psVar5;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
  }
  else {
    std::operator+(&local_348,"\tvalue = ",&local_2e0);
    pFVar11 = local_1f8;
  }
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_348);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_328.field_2._M_allocated_capacity = *psVar5;
    local_328.field_2._8_8_ = plVar3[3];
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  }
  else {
    local_328.field_2._M_allocated_capacity = *psVar5;
    local_328._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_328._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (cVar8 == '\0') {
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,local_2b0 + 1);
    }
  }
  pPVar1 = local_1b0;
  defaultProgramData(local_1b0,(pFVar11->super_ShaderOptimizationCase).m_caseShaderType,&local_258,
                     &local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,
                    CONCAT26(uStack_28a,CONCAT15(uStack_28b,CONCAT14(uStack_28c,local_290))) + 1);
  }
  return pPVar1;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const string precision				= getShaderPrecision(m_caseShaderType);
		const string expression				= "value*vec4(0.8, 0.7, 0.6, 0.9)";
		const string maybeFuncDefs			= optimized ? "" : funcDefinitions(m_callNestingDepth, precision, expression);
		const string mainValueStatement		= (optimized ? "\tvalue = " + expression : "\tvalue = func" + toString(m_callNestingDepth-1) + "(value)") + ";\n";

		return defaultProgramData(m_caseShaderType, maybeFuncDefs, mainValueStatement);
	}